

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall duckdb::LocalStorage::Rollback(LocalStorage *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __node_base _Var1;
  reference_map_t<DataTable,_shared_ptr<LocalTableStorage>_> table_storage;
  _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_40;
  
  LocalTableManager::MoveEntries
            ((reference_map_t<DataTable,_shared_ptr<LocalTableStorage>_> *)&local_40,
             &this->table_manager);
  for (_Var1._M_nxt = local_40._M_before_begin._M_nxt; _Var1._M_nxt != (_Hash_node_base *)0x0;
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    if ((LocalTableStorage *)_Var1._M_nxt[2]._M_nxt != (LocalTableStorage *)0x0) {
      LocalTableStorage::Rollback((LocalTableStorage *)_Var1._M_nxt[2]._M_nxt);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_nxt[3]._M_nxt;
      _Var1._M_nxt[2]._M_nxt = (_Hash_node_base *)0x0;
      _Var1._M_nxt[3]._M_nxt = (_Hash_node_base *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_40);
  return;
}

Assistant:

void LocalStorage::Rollback() {
	// rollback local storage
	// after this, the local storage is no longer required and can be cleared
	auto table_storage = table_manager.MoveEntries();
	for (auto &entry : table_storage) {
		auto storage = entry.second.get();
		if (!storage) {
			continue;
		}
		storage->Rollback();
		entry.second.reset();
	}
}